

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

bool __thiscall Database::BeginTransaction(Database *this)

{
  bool bVar1;
  Database_Result *__return_storage_ptr__;
  Database_Result local_70;
  Database_Result local_50;
  
  bVar1 = this->in_transaction;
  if (bVar1 != false) goto LAB_0012391e;
  __return_storage_ptr__ = &local_70;
  if (this->engine == SQLite) {
    RawQuery(__return_storage_ptr__,this,"BEGIN",true);
LAB_0012390e:
    std::
    vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
    ::~vector(&__return_storage_ptr__->
               super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
             );
  }
  else if (this->engine == MySQL) {
    RawQuery(&local_50,this,"START TRANSACTION",true);
    __return_storage_ptr__ = &local_50;
    goto LAB_0012390e;
  }
  this->in_transaction = true;
LAB_0012391e:
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool Database::BeginTransaction()
{
	if (this->in_transaction)
		return false;

	for (int attempt = 1; ; ++attempt)
	{
		try
		{
			if (attempt > 1)
			{
				Console::Wrn("Start transaction failed. Trying again... (Attempt %i / 10)", attempt);
				util::sleep(1.0 * attempt);
			}

			switch (this->engine)
			{
#ifdef DATABASE_MYSQL
				case MySQL:
					this->RawQuery("START TRANSACTION", true);
					break;
#endif // DATABASE_MYSQL

#ifdef DATABASE_SQLITE
				case SQLite:
					this->RawQuery("BEGIN", true);
					break;
#endif // DATABASE_SQLITE
			}

			break;
		}
		catch (...)
		{
			if (attempt >= 10)
			{
				Console::Err("Failed to begin transaction. Halting server.");
				std::terminate();
			}
		}
	}

	this->in_transaction = true;

	return true;
}